

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [16];
  int iVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  ulong uVar20;
  undefined4 uVar21;
  ulong unaff_R15;
  undefined4 uVar22;
  undefined1 auVar23 [64];
  float fVar24;
  float fVar31;
  float fVar32;
  vint4 bi;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar33;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar34;
  float fVar41;
  float fVar42;
  vint4 bi_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar44;
  float fVar53;
  float fVar54;
  vint4 bi_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  vfloat4 a0;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_3;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 ai;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 ai_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar88 [64];
  undefined1 auVar92 [64];
  float fVar93;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar94 [64];
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar99 [16];
  float fVar103;
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [64];
  undefined1 auVar109 [16];
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10d8 [16];
  RayHit *local_10c0;
  Intersectors *local_10b8;
  RayQueryContext *local_10b0;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [8];
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10b0 = context;
  local_10b8 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar26 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    auVar25 = vrsqrtss_avx(auVar26,auVar26);
    fVar56 = auVar25._0_4_;
    local_fb8[0] = fVar56 * 1.5 - auVar26._0_4_ * 0.5 * fVar56 * fVar56 * fVar56;
    auVar45 = vshufps_avx(ZEXT416((uint)local_fb8[0]),ZEXT416((uint)local_fb8[0]),0);
    auVar57._0_4_ = aVar3.x * auVar45._0_4_;
    auVar57._4_4_ = aVar3.y * auVar45._4_4_;
    auVar57._8_4_ = aVar3.z * auVar45._8_4_;
    auVar57._12_4_ = aVar3.field_3.w * auVar45._12_4_;
    auVar25 = vshufpd_avx(auVar57,auVar57,1);
    auVar26 = vmovshdup_avx(auVar57);
    auVar82._8_4_ = 0x80000000;
    auVar82._0_8_ = 0x8000000080000000;
    auVar82._12_4_ = 0x80000000;
    auVar64._12_4_ = 0;
    auVar64._0_12_ = ZEXT812(0);
    auVar64 = auVar64 << 0x20;
    auVar78 = vunpckhps_avx(auVar57,auVar64);
    auVar72 = vshufps_avx(auVar78,ZEXT416(auVar26._0_4_ ^ 0x80000000),0x41);
    auVar78._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
    auVar78._8_8_ = auVar82._8_8_ ^ auVar25._8_8_;
    auVar78 = vinsertps_avx(auVar78,auVar57,0x2a);
    auVar26 = vdpps_avx(auVar72,auVar72,0x7f);
    auVar25 = vdpps_avx(auVar78,auVar78,0x7f);
    auVar26 = vcmpps_avx(auVar25,auVar26,1);
    auVar26 = vshufps_avx(auVar26,auVar26,0);
    auVar26 = vblendvps_avx(auVar78,auVar72,auVar26);
    auVar25 = vdpps_avx(auVar26,auVar26,0x7f);
    auVar78 = vrsqrtss_avx(auVar25,auVar25);
    fVar56 = auVar78._0_4_;
    auVar25 = ZEXT416((uint)(fVar56 * 1.5 - auVar25._0_4_ * 0.5 * fVar56 * fVar56 * fVar56));
    auVar25 = vshufps_avx(auVar25,auVar25,0);
    auVar72._0_4_ = auVar26._0_4_ * auVar25._0_4_;
    auVar72._4_4_ = auVar26._4_4_ * auVar25._4_4_;
    auVar72._8_4_ = auVar26._8_4_ * auVar25._8_4_;
    auVar72._12_4_ = auVar26._12_4_ * auVar25._12_4_;
    auVar26 = vshufps_avx(auVar72,auVar72,0xc9);
    auVar25 = vshufps_avx(auVar57,auVar57,0xc9);
    auVar83._0_4_ = auVar25._0_4_ * auVar72._0_4_;
    auVar83._4_4_ = auVar25._4_4_ * auVar72._4_4_;
    auVar83._8_4_ = auVar25._8_4_ * auVar72._8_4_;
    auVar83._12_4_ = auVar25._12_4_ * auVar72._12_4_;
    auVar79._0_4_ = auVar57._0_4_ * auVar26._0_4_;
    auVar79._4_4_ = auVar57._4_4_ * auVar26._4_4_;
    auVar79._8_4_ = auVar57._8_4_ * auVar26._8_4_;
    auVar79._12_4_ = auVar57._12_4_ * auVar26._12_4_;
    auVar26 = vsubps_avx(auVar79,auVar83);
    auVar78 = vshufps_avx(auVar26,auVar26,0xc9);
    auVar26 = vdpps_avx(auVar78,auVar78,0x7f);
    auVar25 = vrsqrtss_avx(auVar26,auVar26);
    fVar56 = auVar25._0_4_;
    auVar26 = ZEXT416((uint)(fVar56 * 1.5 - fVar56 * fVar56 * fVar56 * auVar26._0_4_ * 0.5));
    auVar26 = vshufps_avx(auVar26,auVar26,0);
    auVar25._0_4_ = auVar26._0_4_ * auVar78._0_4_;
    auVar25._4_4_ = auVar26._4_4_ * auVar78._4_4_;
    auVar25._8_4_ = auVar26._8_4_ * auVar78._8_4_;
    auVar25._12_4_ = auVar26._12_4_ * auVar78._12_4_;
    auVar26._0_4_ = auVar45._0_4_ * auVar57._0_4_;
    auVar26._4_4_ = auVar45._4_4_ * auVar57._4_4_;
    auVar26._8_4_ = auVar45._8_4_ * auVar57._8_4_;
    auVar26._12_4_ = auVar45._12_4_ * auVar57._12_4_;
    auVar78 = vunpcklps_avx(auVar72,auVar26);
    auVar26 = vunpckhps_avx(auVar72,auVar26);
    auVar45 = vunpcklps_avx(auVar25,auVar64);
    auVar25 = vunpckhps_avx(auVar25,auVar64);
    local_f88 = vunpcklps_avx(auVar26,auVar25);
    local_fa8 = vunpcklps_avx(auVar78,auVar45);
    local_f98 = vunpckhps_avx(auVar78,auVar45);
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      auVar25 = vmaxss_avx(ZEXT416(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar78 = vmaxss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      pauVar18 = (undefined1 (*) [16])local_f68;
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx((undefined1  [16])aVar3,auVar45);
      auVar58._8_4_ = 0x219392ef;
      auVar58._0_8_ = 0x219392ef219392ef;
      auVar58._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar58,1);
      auVar26 = vblendvps_avx((undefined1  [16])aVar3,auVar58,auVar26);
      auVar45 = vrcpps_avx(auVar26);
      fVar56 = auVar45._0_4_;
      auVar46._0_4_ = auVar26._0_4_ * fVar56;
      fVar44 = auVar45._4_4_;
      auVar46._4_4_ = auVar26._4_4_ * fVar44;
      fVar34 = auVar45._8_4_;
      auVar46._8_4_ = auVar26._8_4_ * fVar34;
      fVar24 = auVar45._12_4_;
      auVar46._12_4_ = auVar26._12_4_ * fVar24;
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = &DAT_3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar73,auVar46);
      auVar47._0_4_ = fVar56 + fVar56 * auVar26._0_4_;
      auVar47._4_4_ = fVar44 + fVar44 * auVar26._4_4_;
      auVar47._8_4_ = fVar34 + fVar34 * auVar26._8_4_;
      auVar47._12_4_ = fVar24 + fVar24 * auVar26._12_4_;
      uVar22 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_1058._4_4_ = uVar22;
      local_1058._0_4_ = uVar22;
      local_1058._8_4_ = uVar22;
      local_1058._12_4_ = uVar22;
      auVar88 = ZEXT1664(local_1058);
      uVar22 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_1068._4_4_ = uVar22;
      local_1068._0_4_ = uVar22;
      local_1068._8_4_ = uVar22;
      local_1068._12_4_ = uVar22;
      auVar105 = ZEXT1664(local_1068);
      fVar56 = (ray->super_RayK<1>).org.field_0.m128[2];
      auVar80._4_4_ = fVar56;
      auVar80._0_4_ = fVar56;
      auVar80._8_4_ = fVar56;
      auVar80._12_4_ = fVar56;
      _local_1028 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0);
      _local_1038 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x55);
      _local_1048 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0xaa);
      local_1078 = vshufps_avx(auVar47,auVar47,0);
      auVar85 = ZEXT1664(local_1078);
      auVar26 = vmovshdup_avx(auVar47);
      local_1088 = vshufps_avx(auVar47,auVar47,0x55);
      auVar86 = ZEXT1664(local_1088);
      uVar16 = (ulong)(auVar47._0_4_ < 0.0) * 0x10;
      auVar45 = vshufpd_avx(auVar47,auVar47,1);
      local_1098 = vshufps_avx(auVar47,auVar47,0xaa);
      auVar92 = ZEXT1664(local_1098);
      uVar19 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x20;
      uVar20 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x40;
      local_10a8 = vshufps_avx(auVar25,auVar25,0);
      auVar94 = ZEXT1664(local_10a8);
      auVar26 = vshufps_avx(auVar78,auVar78,0);
      auVar23 = ZEXT1664(auVar26);
      local_10c0 = ray;
      do {
        do {
          if (pauVar18 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar11 = pauVar18 + -1;
          pauVar18 = pauVar18 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar11 + 8));
        uVar14 = *(ulong *)*pauVar18;
        do {
          if ((uVar14 & 8) == 0) {
            fVar44 = (ray->super_RayK<1>).dir.field_0.m128[3];
            uVar15 = (uint)uVar14 & 7;
            uVar13 = uVar14 & 0xfffffffffffffff0;
            uVar22 = (undefined4)(unaff_R15 >> 0x20);
            if (uVar15 == 3) {
              local_ff8 = *(float *)(uVar13 + 0x20);
              fStack_ff4 = *(float *)(uVar13 + 0x24);
              fStack_ff0 = *(float *)(uVar13 + 0x28);
              fStack_fec = *(float *)(uVar13 + 0x2c);
              local_1008 = *(float *)(uVar13 + 0x60);
              fStack_1004 = *(float *)(uVar13 + 100);
              fStack_1000 = *(float *)(uVar13 + 0x68);
              fStack_ffc = *(float *)(uVar13 + 0x6c);
              local_fe8 = *(float *)(uVar13 + 0x70);
              fStack_fe4 = *(float *)(uVar13 + 0x74);
              fStack_fe0 = *(float *)(uVar13 + 0x78);
              fStack_fdc = *(float *)(uVar13 + 0x7c);
              auVar26 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
              fVar98 = auVar26._0_4_;
              fVar100 = auVar26._4_4_;
              fVar101 = auVar26._8_4_;
              fVar102 = auVar26._12_4_;
              fVar44 = 1.0 - fVar44;
              auVar26 = vshufps_avx(ZEXT416((uint)(fVar44 * 0.0)),ZEXT416((uint)(fVar44 * 0.0)),0);
              fVar93 = auVar26._0_4_;
              local_fd8 = fVar93 + fVar98 * *(float *)(uVar13 + 0xe0);
              fVar95 = auVar26._4_4_;
              fStack_fd4 = fVar95 + fVar100 * *(float *)(uVar13 + 0xe4);
              fVar96 = auVar26._8_4_;
              fStack_fd0 = fVar96 + fVar101 * *(float *)(uVar13 + 0xe8);
              fVar97 = auVar26._12_4_;
              fStack_fcc = fVar97 + fVar102 * *(float *)(uVar13 + 0xec);
              local_fc8 = fVar93 + fVar98 * *(float *)(uVar13 + 0xf0);
              fStack_fc4 = fVar95 + fVar100 * *(float *)(uVar13 + 0xf4);
              fStack_fc0 = fVar96 + fVar101 * *(float *)(uVar13 + 0xf8);
              fStack_fbc = fVar97 + fVar102 * *(float *)(uVar13 + 0xfc);
              auVar37._0_4_ =
                   (float)local_1028._0_4_ * local_ff8 +
                   (float)local_1038._0_4_ * *(float *)(uVar13 + 0x50) +
                   *(float *)(uVar13 + 0x80) * (float)local_1048._0_4_;
              auVar37._4_4_ =
                   (float)local_1028._4_4_ * fStack_ff4 +
                   (float)local_1038._4_4_ * *(float *)(uVar13 + 0x54) +
                   *(float *)(uVar13 + 0x84) * (float)local_1048._4_4_;
              auVar37._8_4_ =
                   fStack_1020 * fStack_ff0 +
                   fStack_1030 * *(float *)(uVar13 + 0x58) + *(float *)(uVar13 + 0x88) * fStack_1040
              ;
              auVar37._12_4_ =
                   fStack_101c * fStack_fec +
                   fStack_102c * *(float *)(uVar13 + 0x5c) + *(float *)(uVar13 + 0x8c) * fStack_103c
              ;
              auVar50._0_4_ =
                   *(float *)(uVar13 + 0x30) * (float)local_1028._0_4_ +
                   local_1008 * (float)local_1038._0_4_ +
                   *(float *)(uVar13 + 0x90) * (float)local_1048._0_4_;
              auVar50._4_4_ =
                   *(float *)(uVar13 + 0x34) * (float)local_1028._4_4_ +
                   fStack_1004 * (float)local_1038._4_4_ +
                   *(float *)(uVar13 + 0x94) * (float)local_1048._4_4_;
              auVar50._8_4_ =
                   *(float *)(uVar13 + 0x38) * fStack_1020 +
                   fStack_1000 * fStack_1030 + *(float *)(uVar13 + 0x98) * fStack_1040;
              auVar50._12_4_ =
                   *(float *)(uVar13 + 0x3c) * fStack_101c +
                   fStack_ffc * fStack_102c + *(float *)(uVar13 + 0x9c) * fStack_103c;
              auVar104._0_4_ =
                   *(float *)(uVar13 + 0x40) * (float)local_1028._0_4_ +
                   (float)local_1038._0_4_ * local_fe8 +
                   *(float *)(uVar13 + 0xa0) * (float)local_1048._0_4_;
              auVar104._4_4_ =
                   *(float *)(uVar13 + 0x44) * (float)local_1028._4_4_ +
                   (float)local_1038._4_4_ * fStack_fe4 +
                   *(float *)(uVar13 + 0xa4) * (float)local_1048._4_4_;
              auVar104._8_4_ =
                   *(float *)(uVar13 + 0x48) * fStack_1020 +
                   fStack_1030 * fStack_fe0 + *(float *)(uVar13 + 0xa8) * fStack_1040;
              auVar104._12_4_ =
                   *(float *)(uVar13 + 0x4c) * fStack_101c +
                   fStack_102c * fStack_fdc + *(float *)(uVar13 + 0xac) * fStack_103c;
              auVar67._8_4_ = 0x7fffffff;
              auVar67._0_8_ = 0x7fffffff7fffffff;
              auVar67._12_4_ = 0x7fffffff;
              auVar26 = vandps_avx(auVar37,auVar67);
              auVar27._8_4_ = 0x219392ef;
              auVar27._0_8_ = 0x219392ef219392ef;
              auVar27._12_4_ = 0x219392ef;
              auVar26 = vcmpps_avx(auVar26,auVar27,1);
              auVar25 = vblendvps_avx(auVar37,auVar27,auVar26);
              auVar26 = vandps_avx(auVar50,auVar67);
              auVar26 = vcmpps_avx(auVar26,auVar27,1);
              auVar78 = vblendvps_avx(auVar50,auVar27,auVar26);
              auVar26 = vandps_avx(auVar104,auVar67);
              auVar26 = vcmpps_avx(auVar26,auVar27,1);
              auVar26 = vblendvps_avx(auVar104,auVar27,auVar26);
              auVar45 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
              fVar44 = auVar45._0_4_;
              auVar109._0_4_ = fVar44 + fVar98 * *(float *)(uVar13 + 0x110);
              fVar34 = auVar45._4_4_;
              auVar109._4_4_ = fVar34 + fVar100 * *(float *)(uVar13 + 0x114);
              fVar24 = auVar45._8_4_;
              auVar109._8_4_ = fVar24 + fVar101 * *(float *)(uVar13 + 0x118);
              fVar53 = auVar45._12_4_;
              auVar109._12_4_ = fVar53 + fVar102 * *(float *)(uVar13 + 0x11c);
              local_1018 = fVar44 + fVar98 * *(float *)(uVar13 + 0x120);
              fStack_1014 = fVar34 + fVar100 * *(float *)(uVar13 + 0x124);
              fStack_1010 = fVar24 + fVar101 * *(float *)(uVar13 + 0x128);
              fStack_100c = fVar53 + fVar102 * *(float *)(uVar13 + 300);
              auVar99._0_4_ = fVar98 * *(float *)(uVar13 + 0x130) + fVar44;
              auVar99._4_4_ = fVar100 * *(float *)(uVar13 + 0x134) + fVar34;
              auVar99._8_4_ = fVar101 * *(float *)(uVar13 + 0x138) + fVar24;
              auVar99._12_4_ = fVar102 * *(float *)(uVar13 + 0x13c) + fVar53;
              auVar45 = vrcpps_avx(auVar25);
              fVar44 = auVar45._0_4_;
              auVar38._0_4_ = auVar25._0_4_ * fVar44;
              fVar53 = auVar45._4_4_;
              auVar38._4_4_ = auVar25._4_4_ * fVar53;
              fVar54 = auVar45._8_4_;
              auVar38._8_4_ = auVar25._8_4_ * fVar54;
              fVar55 = auVar45._12_4_;
              auVar38._12_4_ = auVar25._12_4_ * fVar55;
              auVar63._8_4_ = 0x3f800000;
              auVar63._0_8_ = &DAT_3f8000003f800000;
              auVar63._12_4_ = 0x3f800000;
              auVar25 = vsubps_avx(auVar63,auVar38);
              fVar44 = fVar44 + fVar44 * auVar25._0_4_;
              fVar53 = fVar53 + fVar53 * auVar25._4_4_;
              fVar54 = fVar54 + fVar54 * auVar25._8_4_;
              fVar55 = fVar55 + fVar55 * auVar25._12_4_;
              auVar25 = vrcpps_avx(auVar78);
              fVar34 = auVar25._0_4_;
              auVar28._0_4_ = auVar78._0_4_ * fVar34;
              fVar41 = auVar25._4_4_;
              auVar28._4_4_ = auVar78._4_4_ * fVar41;
              fVar42 = auVar25._8_4_;
              auVar28._8_4_ = auVar78._8_4_ * fVar42;
              fVar43 = auVar25._12_4_;
              auVar28._12_4_ = auVar78._12_4_ * fVar43;
              auVar25 = vsubps_avx(auVar63,auVar28);
              fVar34 = fVar34 + fVar34 * auVar25._0_4_;
              fVar41 = fVar41 + fVar41 * auVar25._4_4_;
              fVar42 = fVar42 + fVar42 * auVar25._8_4_;
              fVar43 = fVar43 + fVar43 * auVar25._12_4_;
              auVar25 = vrcpps_avx(auVar26);
              fVar24 = auVar25._0_4_;
              auVar68._0_4_ = auVar26._0_4_ * fVar24;
              fVar31 = auVar25._4_4_;
              auVar68._4_4_ = auVar26._4_4_ * fVar31;
              fVar32 = auVar25._8_4_;
              auVar68._8_4_ = auVar26._8_4_ * fVar32;
              fVar33 = auVar25._12_4_;
              auVar68._12_4_ = auVar26._12_4_ * fVar33;
              auVar105 = ZEXT1664(local_1068);
              auVar26 = vsubps_avx(auVar63,auVar68);
              fVar24 = fVar24 + fVar24 * auVar26._0_4_;
              fVar31 = fVar31 + fVar31 * auVar26._4_4_;
              fVar32 = fVar32 + fVar32 * auVar26._8_4_;
              fVar33 = fVar33 + fVar33 * auVar26._12_4_;
              auVar88 = ZEXT1664(local_1058);
              fVar103 = local_1068._0_4_;
              fVar106 = local_1068._4_4_;
              fVar107 = local_1068._8_4_;
              fVar108 = local_1068._12_4_;
              fVar87 = local_1058._0_4_;
              fVar89 = local_1058._4_4_;
              fVar90 = local_1058._8_4_;
              fVar91 = local_1058._12_4_;
              auVar69._0_4_ =
                   fVar87 * local_ff8 +
                   fVar103 * *(float *)(uVar13 + 0x50) +
                   *(float *)(uVar13 + 0x80) * fVar56 + *(float *)(uVar13 + 0xb0);
              auVar69._4_4_ =
                   fVar89 * fStack_ff4 +
                   fVar106 * *(float *)(uVar13 + 0x54) +
                   *(float *)(uVar13 + 0x84) * fVar56 + *(float *)(uVar13 + 0xb4);
              auVar69._8_4_ =
                   fVar90 * fStack_ff0 +
                   fVar107 * *(float *)(uVar13 + 0x58) +
                   *(float *)(uVar13 + 0x88) * fVar56 + *(float *)(uVar13 + 0xb8);
              auVar69._12_4_ =
                   fVar91 * fStack_fec +
                   fVar108 * *(float *)(uVar13 + 0x5c) +
                   *(float *)(uVar13 + 0x8c) * fVar56 + *(float *)(uVar13 + 0xbc);
              auVar92 = ZEXT1664(local_1098);
              auVar76._0_4_ =
                   fVar87 * *(float *)(uVar13 + 0x30) +
                   fVar103 * local_1008 +
                   *(float *)(uVar13 + 0x90) * fVar56 + *(float *)(uVar13 + 0xc0);
              auVar76._4_4_ =
                   fVar89 * *(float *)(uVar13 + 0x34) +
                   fVar106 * fStack_1004 +
                   *(float *)(uVar13 + 0x94) * fVar56 + *(float *)(uVar13 + 0xc4);
              auVar76._8_4_ =
                   fVar90 * *(float *)(uVar13 + 0x38) +
                   fVar107 * fStack_1000 +
                   *(float *)(uVar13 + 0x98) * fVar56 + *(float *)(uVar13 + 200);
              auVar76._12_4_ =
                   fVar91 * *(float *)(uVar13 + 0x3c) +
                   fVar108 * fStack_ffc +
                   *(float *)(uVar13 + 0x9c) * fVar56 + *(float *)(uVar13 + 0xcc);
              auVar94 = ZEXT1664(local_10a8);
              auVar81._0_4_ =
                   fVar87 * *(float *)(uVar13 + 0x40) +
                   *(float *)(uVar13 + 0xa0) * fVar56 + *(float *)(uVar13 + 0xd0) +
                   fVar103 * local_fe8;
              auVar81._4_4_ =
                   fVar89 * *(float *)(uVar13 + 0x44) +
                   *(float *)(uVar13 + 0xa4) * fVar56 + *(float *)(uVar13 + 0xd4) +
                   fVar106 * fStack_fe4;
              auVar81._8_4_ =
                   fVar90 * *(float *)(uVar13 + 0x48) +
                   *(float *)(uVar13 + 0xa8) * fVar56 + *(float *)(uVar13 + 0xd8) +
                   fVar107 * fStack_fe0;
              auVar81._12_4_ =
                   fVar91 * *(float *)(uVar13 + 0x4c) +
                   *(float *)(uVar13 + 0xac) * fVar56 + *(float *)(uVar13 + 0xdc) +
                   fVar108 * fStack_fdc;
              auVar9._4_4_ = fStack_fd4;
              auVar9._0_4_ = local_fd8;
              auVar9._8_4_ = fStack_fd0;
              auVar9._12_4_ = fStack_fcc;
              auVar26 = vsubps_avx(auVar9,auVar69);
              auVar25 = vsubps_avx(auVar109,auVar69);
              auVar10._4_4_ = fStack_fc4;
              auVar10._0_4_ = local_fc8;
              auVar10._8_4_ = fStack_fc0;
              auVar10._12_4_ = fStack_fbc;
              auVar78 = vsubps_avx(auVar10,auVar76);
              auVar8._4_4_ = fStack_1014;
              auVar8._0_4_ = local_1018;
              auVar8._8_4_ = fStack_1010;
              auVar8._12_4_ = fStack_100c;
              auVar45 = vsubps_avx(auVar8,auVar76);
              auVar7._4_4_ = fVar95 + fVar100 * *(float *)(uVar13 + 0x104);
              auVar7._0_4_ = fVar93 + fVar98 * *(float *)(uVar13 + 0x100);
              auVar7._8_4_ = fVar96 + fVar101 * *(float *)(uVar13 + 0x108);
              auVar7._12_4_ = fVar97 + fVar102 * *(float *)(uVar13 + 0x10c);
              auVar72 = vsubps_avx(auVar7,auVar81);
              auVar64 = vsubps_avx(auVar99,auVar81);
              auVar84._0_4_ = auVar26._0_4_ * fVar44;
              auVar84._4_4_ = auVar26._4_4_ * fVar53;
              auVar84._8_4_ = auVar26._8_4_ * fVar54;
              auVar84._12_4_ = auVar26._12_4_ * fVar55;
              auVar51._0_4_ = auVar25._0_4_ * fVar44;
              auVar51._4_4_ = auVar25._4_4_ * fVar53;
              auVar51._8_4_ = auVar25._8_4_ * fVar54;
              auVar51._12_4_ = auVar25._12_4_ * fVar55;
              auVar70._0_4_ = auVar78._0_4_ * fVar34;
              auVar70._4_4_ = auVar78._4_4_ * fVar41;
              auVar70._8_4_ = auVar78._8_4_ * fVar42;
              auVar70._12_4_ = auVar78._12_4_ * fVar43;
              auVar86 = ZEXT1664(local_1088);
              auVar77._0_4_ = auVar72._0_4_ * fVar24;
              auVar77._4_4_ = auVar72._4_4_ * fVar31;
              auVar77._8_4_ = auVar72._8_4_ * fVar32;
              auVar77._12_4_ = auVar72._12_4_ * fVar33;
              auVar39._0_4_ = auVar45._0_4_ * fVar34;
              auVar39._4_4_ = auVar45._4_4_ * fVar41;
              auVar39._8_4_ = auVar45._8_4_ * fVar42;
              auVar39._12_4_ = auVar45._12_4_ * fVar43;
              auVar29._0_4_ = auVar64._0_4_ * fVar24;
              auVar29._4_4_ = auVar64._4_4_ * fVar31;
              auVar29._8_4_ = auVar64._8_4_ * fVar32;
              auVar29._12_4_ = auVar64._12_4_ * fVar33;
              auVar26 = vpminsd_avx(auVar70,auVar39);
              auVar25 = vpminsd_avx(auVar77,auVar29);
              auVar26 = vmaxps_avx(auVar26,auVar25);
              auVar72 = vpminsd_avx(auVar84,auVar51);
              auVar45 = vpmaxsd_avx(auVar84,auVar51);
              auVar85 = ZEXT1664(local_1078);
              auVar25 = vpmaxsd_avx(auVar70,auVar39);
              auVar78 = vpmaxsd_avx(auVar77,auVar29);
              auVar78 = vminps_avx(auVar25,auVar78);
              auVar25 = vmaxps_avx(local_10a8,auVar72);
              local_10d8 = vmaxps_avx(auVar25,auVar26);
              auVar26 = vminps_avx(auVar23._0_16_,auVar45);
              auVar26 = vminps_avx(auVar26,auVar78);
              auVar26 = vcmpps_avx(local_10d8,auVar26,2);
              uVar21 = vmovmskps_avx(auVar26);
              unaff_R15 = CONCAT44(uVar22,uVar21);
            }
            else {
              auVar45 = vshufps_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),0);
              pfVar2 = (float *)(uVar13 + 0x80 + uVar16);
              fVar44 = auVar45._0_4_;
              fVar34 = auVar45._4_4_;
              fVar24 = auVar45._8_4_;
              fVar53 = auVar45._12_4_;
              pfVar1 = (float *)(uVar13 + 0x20 + uVar16);
              auVar35._0_4_ = fVar44 * *pfVar2 + *pfVar1;
              auVar35._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
              auVar35._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
              auVar35._12_4_ = fVar53 * pfVar2[3] + pfVar1[3];
              auVar26 = vsubps_avx(auVar35,auVar88._0_16_);
              pfVar2 = (float *)(uVar13 + 0x80 + uVar19);
              auVar36._0_4_ = auVar85._0_4_ * auVar26._0_4_;
              auVar36._4_4_ = auVar85._4_4_ * auVar26._4_4_;
              auVar36._8_4_ = auVar85._8_4_ * auVar26._8_4_;
              auVar36._12_4_ = auVar85._12_4_ * auVar26._12_4_;
              pfVar1 = (float *)(uVar13 + 0x20 + uVar19);
              auVar48._0_4_ = fVar44 * *pfVar2 + *pfVar1;
              auVar48._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
              auVar48._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
              auVar48._12_4_ = fVar53 * pfVar2[3] + pfVar1[3];
              auVar26 = vsubps_avx(auVar48,auVar105._0_16_);
              pfVar2 = (float *)(uVar13 + 0x80 + uVar20);
              pfVar1 = (float *)(uVar13 + 0x20 + uVar20);
              auVar59._0_4_ = fVar44 * *pfVar2 + *pfVar1;
              auVar59._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
              auVar59._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
              auVar59._12_4_ = fVar53 * pfVar2[3] + pfVar1[3];
              auVar49._0_4_ = auVar86._0_4_ * auVar26._0_4_;
              auVar49._4_4_ = auVar86._4_4_ * auVar26._4_4_;
              auVar49._8_4_ = auVar86._8_4_ * auVar26._8_4_;
              auVar49._12_4_ = auVar86._12_4_ * auVar26._12_4_;
              auVar26 = vsubps_avx(auVar59,auVar80);
              auVar60._0_4_ = auVar92._0_4_ * auVar26._0_4_;
              auVar60._4_4_ = auVar92._4_4_ * auVar26._4_4_;
              auVar60._8_4_ = auVar92._8_4_ * auVar26._8_4_;
              auVar60._12_4_ = auVar92._12_4_ * auVar26._12_4_;
              auVar26 = vmaxps_avx(auVar49,auVar60);
              pfVar2 = (float *)(uVar13 + 0x80 + (uVar16 ^ 0x10));
              pfVar1 = (float *)(uVar13 + 0x20 + (uVar16 ^ 0x10));
              auVar61._0_4_ = fVar44 * *pfVar2 + *pfVar1;
              auVar61._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
              auVar61._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
              auVar61._12_4_ = fVar53 * pfVar2[3] + pfVar1[3];
              auVar25 = vsubps_avx(auVar61,auVar88._0_16_);
              auVar62._0_4_ = auVar85._0_4_ * auVar25._0_4_;
              auVar62._4_4_ = auVar85._4_4_ * auVar25._4_4_;
              auVar62._8_4_ = auVar85._8_4_ * auVar25._8_4_;
              auVar62._12_4_ = auVar85._12_4_ * auVar25._12_4_;
              pfVar2 = (float *)(uVar13 + 0x80 + (uVar19 ^ 0x10));
              pfVar1 = (float *)(uVar13 + 0x20 + (uVar19 ^ 0x10));
              auVar65._0_4_ = fVar44 * *pfVar2 + *pfVar1;
              auVar65._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
              auVar65._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
              auVar65._12_4_ = fVar53 * pfVar2[3] + pfVar1[3];
              auVar25 = vsubps_avx(auVar65,auVar105._0_16_);
              auVar66._0_4_ = auVar86._0_4_ * auVar25._0_4_;
              auVar66._4_4_ = auVar86._4_4_ * auVar25._4_4_;
              auVar66._8_4_ = auVar86._8_4_ * auVar25._8_4_;
              auVar66._12_4_ = auVar86._12_4_ * auVar25._12_4_;
              pfVar2 = (float *)(uVar13 + 0x80 + (uVar20 ^ 0x10));
              pfVar1 = (float *)(uVar13 + 0x20 + (uVar20 ^ 0x10));
              auVar74._0_4_ = fVar44 * *pfVar2 + *pfVar1;
              auVar74._4_4_ = fVar34 * pfVar2[1] + pfVar1[1];
              auVar74._8_4_ = fVar24 * pfVar2[2] + pfVar1[2];
              auVar74._12_4_ = fVar53 * pfVar2[3] + pfVar1[3];
              auVar25 = vsubps_avx(auVar74,auVar80);
              auVar75._0_4_ = auVar92._0_4_ * auVar25._0_4_;
              auVar75._4_4_ = auVar92._4_4_ * auVar25._4_4_;
              auVar75._8_4_ = auVar92._8_4_ * auVar25._8_4_;
              auVar75._12_4_ = auVar92._12_4_ * auVar25._12_4_;
              auVar78 = vminps_avx(auVar66,auVar75);
              auVar25 = vmaxps_avx(auVar94._0_16_,auVar36);
              local_10d8 = vmaxps_avx(auVar25,auVar26);
              auVar26 = vminps_avx(auVar23._0_16_,auVar62);
              auVar26 = vminps_avx(auVar26,auVar78);
              if (uVar15 == 6) {
                auVar25 = vcmpps_avx(local_10d8,auVar26,2);
                auVar26 = vcmpps_avx(*(undefined1 (*) [16])(uVar13 + 0xe0),auVar45,2);
                auVar78 = vcmpps_avx(auVar45,*(undefined1 (*) [16])(uVar13 + 0xf0),1);
                auVar26 = vandps_avx(auVar26,auVar78);
                auVar26 = vandps_avx(auVar26,auVar25);
              }
              else {
                auVar26 = vcmpps_avx(local_10d8,auVar26,2);
              }
              auVar26 = vpslld_avx(auVar26,0x1f);
              uVar21 = vmovmskps_avx(auVar26);
              unaff_R15 = CONCAT44(uVar22,uVar21);
            }
          }
          if ((uVar14 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar12 = 4;
            }
            else {
              uVar13 = uVar14 & 0xfffffffffffffff0;
              lVar6 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              iVar12 = 0;
              uVar14 = *(ulong *)(uVar13 + lVar6 * 8);
              uVar17 = unaff_R15 - 1 & unaff_R15;
              if (uVar17 != 0) {
                uVar15 = *(uint *)(local_10d8 + lVar6 * 4);
                lVar6 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                uVar5 = *(ulong *)(uVar13 + lVar6 * 8);
                uVar4 = *(uint *)(local_10d8 + lVar6 * 4);
                uVar17 = uVar17 - 1 & uVar17;
                if (uVar17 == 0) {
                  if (uVar15 < uVar4) {
                    *(ulong *)*pauVar18 = uVar5;
                    *(uint *)(*pauVar18 + 8) = uVar4;
                    pauVar18 = pauVar18 + 1;
                  }
                  else {
                    *(ulong *)*pauVar18 = uVar14;
                    *(uint *)(*pauVar18 + 8) = uVar15;
                    uVar14 = uVar5;
                    pauVar18 = pauVar18 + 1;
                  }
                }
                else {
                  auVar30._8_8_ = 0;
                  auVar30._0_8_ = uVar14;
                  auVar26 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar15));
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar5;
                  auVar25 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar4));
                  lVar6 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                    }
                  }
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = *(ulong *)(uVar13 + lVar6 * 8);
                  auVar45 = vpunpcklqdq_avx(auVar52,ZEXT416(*(uint *)(local_10d8 + lVar6 * 4)));
                  auVar78 = vpcmpgtd_avx(auVar25,auVar26);
                  uVar17 = uVar17 - 1 & uVar17;
                  if (uVar17 == 0) {
                    auVar72 = vpshufd_avx(auVar78,0xaa);
                    auVar78 = vblendvps_avx(auVar25,auVar26,auVar72);
                    auVar26 = vblendvps_avx(auVar26,auVar25,auVar72);
                    auVar25 = vpcmpgtd_avx(auVar45,auVar78);
                    auVar72 = vpshufd_avx(auVar25,0xaa);
                    auVar25 = vblendvps_avx(auVar45,auVar78,auVar72);
                    auVar78 = vblendvps_avx(auVar78,auVar45,auVar72);
                    auVar45 = vpcmpgtd_avx(auVar78,auVar26);
                    auVar72 = vpshufd_avx(auVar45,0xaa);
                    auVar45 = vblendvps_avx(auVar78,auVar26,auVar72);
                    auVar26 = vblendvps_avx(auVar26,auVar78,auVar72);
                    *pauVar18 = auVar26;
                    pauVar18[1] = auVar45;
                    uVar14 = auVar25._0_8_;
                    pauVar18 = pauVar18 + 2;
                  }
                  else {
                    lVar6 = 0;
                    if (uVar17 != 0) {
                      for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                      }
                    }
                    auVar71._8_8_ = 0;
                    auVar71._0_8_ = *(ulong *)(uVar13 + lVar6 * 8);
                    auVar64 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_10d8 + lVar6 * 4)));
                    auVar72 = vpshufd_avx(auVar78,0xaa);
                    auVar78 = vblendvps_avx(auVar25,auVar26,auVar72);
                    auVar26 = vblendvps_avx(auVar26,auVar25,auVar72);
                    auVar25 = vpcmpgtd_avx(auVar64,auVar45);
                    auVar72 = vpshufd_avx(auVar25,0xaa);
                    auVar25 = vblendvps_avx(auVar64,auVar45,auVar72);
                    auVar45 = vblendvps_avx(auVar45,auVar64,auVar72);
                    auVar72 = vpcmpgtd_avx(auVar45,auVar26);
                    auVar64 = vpshufd_avx(auVar72,0xaa);
                    auVar72 = vblendvps_avx(auVar45,auVar26,auVar64);
                    auVar26 = vblendvps_avx(auVar26,auVar45,auVar64);
                    auVar45 = vpcmpgtd_avx(auVar25,auVar78);
                    auVar64 = vpshufd_avx(auVar45,0xaa);
                    auVar45 = vblendvps_avx(auVar25,auVar78,auVar64);
                    auVar25 = vblendvps_avx(auVar78,auVar25,auVar64);
                    auVar78 = vpcmpgtd_avx(auVar72,auVar25);
                    auVar64 = vpshufd_avx(auVar78,0xaa);
                    auVar78 = vblendvps_avx(auVar72,auVar25,auVar64);
                    auVar25 = vblendvps_avx(auVar25,auVar72,auVar64);
                    *pauVar18 = auVar26;
                    pauVar18[1] = auVar25;
                    pauVar18[2] = auVar78;
                    uVar14 = auVar45._0_8_;
                    pauVar18 = pauVar18 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar12 = 6;
          }
        } while (iVar12 == 0);
        if (iVar12 == 6) {
          (**(code **)((long)local_10b8->leafIntersector +
                      (ulong)*(byte *)(uVar14 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_10b0);
          auVar94 = ZEXT1664(local_10a8);
          auVar92 = ZEXT1664(local_1098);
          auVar86 = ZEXT1664(local_1088);
          auVar85 = ZEXT1664(local_1078);
          auVar105 = ZEXT1664(local_1068);
          auVar88 = ZEXT1664(local_1058);
          fVar44 = (local_10c0->super_RayK<1>).tfar;
          auVar23 = ZEXT1664(CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,fVar44))));
          ray = local_10c0;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }